

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O3

bool __thiscall UniValue::findKey(UniValue *this,string *key,size_t *retIdx)

{
  long lVar1;
  pointer pbVar2;
  pointer __s2;
  size_t __n;
  int iVar3;
  size_type *psVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  long in_FS_OFFSET;
  bool bVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar2 = (this->keys).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->keys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  if (lVar5 == 0) {
    bVar8 = false;
  }
  else {
    uVar6 = lVar5 >> 5;
    __s2 = (key->_M_dataplus)._M_p;
    __n = key->_M_string_length;
    psVar4 = &pbVar2->_M_string_length;
    bVar8 = true;
    sVar7 = 0;
    do {
      if ((*psVar4 == __n) &&
         ((__n == 0 ||
          (iVar3 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar4 + -1))->_M_dataplus)._M_p,__s2,__n), iVar3 == 0)))) {
        *retIdx = sVar7;
        break;
      }
      sVar7 = sVar7 + 1;
      bVar8 = sVar7 < uVar6;
      psVar4 = psVar4 + 4;
    } while (uVar6 + (uVar6 == 0) != sVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool UniValue::findKey(const std::string& key, size_t& retIdx) const
{
    for (size_t i = 0; i < keys.size(); i++) {
        if (keys[i] == key) {
            retIdx = i;
            return true;
        }
    }

    return false;
}